

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

Elem * new_term_string(Grammar *g,char *s,char *e,Rule *r)

{
  uint uVar1;
  Term *t_00;
  char *pcVar2;
  Elem *pEVar3;
  Elem *elem;
  Term *t;
  Rule *r_local;
  char *e_local;
  char *s_local;
  Grammar *g_local;
  
  t_00 = new_term();
  pcVar2 = (char *)malloc((size_t)(e + (1 - (long)s)));
  t_00->string = pcVar2;
  memcpy(t_00->string,s,(long)e - (long)s);
  t_00->string[(long)e - (long)s] = '\0';
  t_00->string_len = (int)e - (int)s;
  if ((g->terminals).v == (Term **)0x0) {
    (g->terminals).v = (g->terminals).e;
    uVar1 = (g->terminals).n;
    (g->terminals).n = uVar1 + 1;
    (g->terminals).e[uVar1] = t_00;
  }
  else {
    if ((g->terminals).v == (g->terminals).e) {
      if ((g->terminals).n < 3) {
        uVar1 = (g->terminals).n;
        (g->terminals).n = uVar1 + 1;
        (g->terminals).v[uVar1] = t_00;
        goto LAB_0013e167;
      }
    }
    else if (((g->terminals).n & 7) != 0) {
      uVar1 = (g->terminals).n;
      (g->terminals).n = uVar1 + 1;
      (g->terminals).v[uVar1] = t_00;
      goto LAB_0013e167;
    }
    vec_add_internal(&g->terminals,t_00);
  }
LAB_0013e167:
  pEVar3 = new_elem_term(t_00,r);
  return pEVar3;
}

Assistant:

static Elem *new_term_string(Grammar *g, char *s, char *e, Rule *r) {
  Term *t = new_term();
  Elem *elem;

  t->string = MALLOC(e - s + 1);
  memcpy(t->string, s, e - s);
  t->string[e - s] = 0;
  t->string_len = e - s;
  vec_add(&g->terminals, t);
  elem = new_elem_term(t, r);
  return elem;
}